

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O1

bool basisu::unpack_bc7_mode1_3_7(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  byte bVar1;
  undefined4 *puVar2;
  uint32_t bits;
  uint uVar3;
  uint uVar4;
  uint8_t uVar5;
  uint uVar6;
  undefined1 *puVar7;
  uint32_t total_bits_1;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar8;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar9;
  uint uVar10;
  long lVar11;
  char *__assertion;
  uint32_t total_bits_2;
  uint uVar12;
  uint32_t total_bits;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint32_t bits_2;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  uint32_t bits_1;
  uint uVar22;
  bool bVar23;
  color_rgba endpoints [4];
  uint32_t pbits [4];
  color_rgba block_colors [2] [8];
  uint32_t weights [16];
  undefined1 local_d8 [4];
  undefined1 local_d4 [12];
  uint auStack_c8 [4];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_b8 [16];
  uint auStack_78 [18];
  
  bVar23 = mode == 1;
  uVar4 = 5;
  if (mode != 7) {
    uVar4 = bVar23 ^ 7;
  }
  uVar10 = mode + 1;
  if (0x20 < uVar10) {
    __assert_fail("codesize <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                  ,0x71,"uint32_t basisu::read_bits32(const uint8_t *, uint32_t &, uint32_t)");
  }
  if (uVar10 == 0) {
    uVar12 = 0;
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    uVar13 = 0;
    uVar12 = 0;
    do {
      iVar15 = 8 - (uVar12 & 7);
      if ((int)(uVar10 - uVar13) < iVar15) {
        iVar15 = uVar10 - uVar13;
      }
      uVar6 = uVar6 | (~(-1 << ((byte)iVar15 & 0x1f)) &
                      (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >>
                            (sbyte)(uVar12 & 7))) << ((byte)uVar13 & 0x1f);
      uVar13 = uVar13 + iVar15;
      uVar12 = uVar12 + iVar15;
    } while (uVar13 < uVar10);
  }
  uVar10 = 1 << ((byte)mode & 0x1f);
  if (uVar6 == uVar10) {
    uVar13 = bVar23 | 2;
    uVar21 = 0;
    uVar14 = 0;
    do {
      iVar15 = 8 - (uVar12 & 7);
      if ((int)(6 - uVar14) < iVar15) {
        iVar15 = 6 - uVar14;
      }
      uVar3 = (uint)uVar21 |
              (~(-1 << ((byte)iVar15 & 0x1f)) &
              (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >> (sbyte)(uVar12 & 7))) <<
              ((byte)uVar14 & 0x1f);
      uVar21 = (ulong)uVar3;
      uVar14 = uVar14 + iVar15;
      uVar12 = iVar15 + uVar12;
    } while (uVar14 < 6);
    uVar17 = (ulong)((mode == 7) + 3);
    uVar18 = 0;
    do {
      lVar11 = 0;
      do {
        uVar22 = 0;
        uVar14 = 0;
        do {
          uVar20 = uVar12;
          uVar16 = uVar20 & 7;
          iVar19 = uVar4 - uVar14;
          iVar15 = 8 - uVar16;
          if (iVar19 < (int)(8 - uVar16)) {
            iVar15 = iVar19;
          }
          uVar22 = uVar22 | (~(-1 << ((byte)iVar15 & 0x1f)) &
                            (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar20 >> 3)) >>
                                  (sbyte)uVar16)) << ((byte)uVar14 & 0x1f);
          uVar14 = uVar14 + iVar15;
          uVar12 = iVar15 + uVar20;
        } while (uVar14 < uVar4);
        if (3 < uVar18) {
LAB_0024c194:
          __assert_fail("index < 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                        ,0x375,"uint8_t &basisu::color_rgba::operator[](uint32_t)");
        }
        local_d8[lVar11 * 4 + uVar18] = (char)uVar22;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar17);
    iVar15 = 8 - uVar16;
    if (iVar19 < (int)(8 - uVar16)) {
      iVar15 = iVar19;
    }
    lVar11 = 0;
    do {
      uVar12 = iVar15 + uVar20 + (int)lVar11;
      auStack_c8[lVar11] =
           (uint)((*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >> (uVar12 & 7) & 1) != 0);
      lVar11 = lVar11 + 1;
    } while ((ulong)!bVar23 * 2 + 2 != lVar11);
    iVar15 = 8 - uVar16;
    if (iVar19 < (int)(8 - uVar16)) {
      iVar15 = iVar19;
    }
    uVar12 = uVar20 + (int)lVar11 + iVar15;
    uVar18 = 0;
    do {
      if ((uVar18 == 0) ||
         (uVar14 = uVar13, uVar18 == (byte)basist::g_bc7_table_anchor_index_second_subset[uVar21]))
      {
        uVar14 = uVar13 - 1;
      }
      uVar20 = 0;
      uVar22 = 0;
      do {
        iVar15 = 8 - (uVar12 & 7);
        if ((int)(uVar14 - uVar22) < iVar15) {
          iVar15 = uVar14 - uVar22;
        }
        uVar20 = uVar20 | (~(-1 << ((byte)iVar15 & 0x1f)) &
                          (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >>
                                (sbyte)(uVar12 & 7))) << ((byte)uVar22 & 0x1f);
        uVar22 = uVar22 + iVar15;
        uVar12 = iVar15 + uVar12;
      } while (uVar22 < uVar14);
      auStack_78[uVar18] = uVar20;
      uVar18 = uVar18 + 1;
    } while (uVar18 != 0x10);
    if (uVar12 != 0x80) {
      __assert_fail("bit_offset == 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                    ,0x216,"bool basisu::unpack_bc7_mode1_3_7(uint32_t, const void *, color_rgba *)"
                   );
    }
    bVar1 = (byte)uVar4;
    puVar7 = local_d8;
    lVar11 = 0;
    do {
      uVar21 = 0;
      do {
        uVar4 = 0xff;
        if (uVar17 != uVar21) {
          if ((byte)puVar7[uVar21] >> bVar1 != 0) {
            __assertion = "val < (1U << val_bits)";
LAB_0024c20a:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                          ,0x1b0,"uint32_t basisu::bc7_dequant(uint32_t, uint32_t, uint32_t)");
          }
          if (1 < auStack_c8[(uint)lVar11 >> (mode == 1)]) {
            __assertion = "pbit < 2";
            goto LAB_0024c20a;
          }
          uVar4 = auStack_c8[(uint)lVar11 >> (mode == 1)] + (uint)(byte)puVar7[uVar21] * 2 <<
                  (bVar1 ^ 7);
          uVar4 = uVar4 >> bVar1 + 1 | uVar4;
          if (0xff < uVar4) {
            __assertion = "val <= 255";
            goto LAB_0024c20a;
          }
        }
        puVar7[uVar21] = (char)uVar4;
        uVar21 = uVar21 + 1;
      } while (uVar21 != 4);
      lVar11 = lVar11 + 1;
      puVar7 = puVar7 + 4;
    } while (lVar11 != 4);
    paVar9 = local_b8;
    puVar7 = local_d4;
    lVar11 = 0;
    do {
      uVar21 = 0;
      paVar8 = paVar9;
      do {
        uVar18 = 0;
        do {
          if (uVar18 == 4) goto LAB_0024c194;
          if (mode == 1) {
            puVar2 = &basist::g_bc7_weights3;
            if (7 < uVar21) {
              __assert_fail("w < 8",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                            ,0x1b4,"uint32_t basisu::bc7_interp3(uint32_t, uint32_t, uint32_t)");
            }
          }
          else {
            puVar2 = &basist::g_bc7_weights2;
            if (3 < uVar21) {
              __assert_fail("w < 4",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                            ,0x1b3,"uint32_t basisu::bc7_interp2(uint32_t, uint32_t, uint32_t)");
            }
          }
          paVar8->m_comps[uVar18] =
               (uint8_t)((0x40 - puVar2[uVar21]) * (uint)(byte)puVar7[uVar18 - 4] +
                         (uint)(byte)puVar7[uVar18] * puVar2[uVar21] + 0x20 >> 6);
          uVar18 = uVar18 + 1;
        } while (uVar17 != uVar18);
        uVar5 = 0xff;
        if (mode == 7) {
          uVar5 = local_b8[0].m_comps[uVar21 * 4 + lVar11 * 0x20 + 3];
        }
        local_b8[0].m_comps[uVar21 * 4 + lVar11 * 0x20 + 3] = uVar5;
        uVar21 = uVar21 + 1;
        paVar8 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)(paVar8->m_comps + 4);
      } while ((uint)uVar21 >> (sbyte)uVar13 == 0);
      puVar7 = puVar7 + 8;
      paVar9 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)(paVar9->m_comps + 0x20);
      bVar23 = lVar11 == 0;
      lVar11 = lVar11 + 1;
    } while (bVar23);
    lVar11 = 0;
    do {
      pPixels[lVar11].field_0 =
           local_b8[(ulong)(byte)basist::g_bc7_partition2[lVar11 + (ulong)(uVar3 << 4)] * 8 +
                    (ulong)auStack_78[lVar11]];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x10);
  }
  return uVar6 == uVar10;
}

Assistant:

bool unpack_bc7_mode1_3_7(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
	{
		//const uint32_t SUBSETS = 2;
		const uint32_t ENDPOINTS = 4;
		const uint32_t COMPS = (mode == 7) ? 4 : 3;
		const uint32_t WEIGHT_BITS = (mode == 1) ? 3 : 2;
		const uint32_t ENDPOINT_BITS = (mode == 7) ? 5 : ((mode == 1) ? 6 : 7);
		const uint32_t PBITS = (mode == 1) ? 2 : 4;
		const uint32_t SHARED_PBITS = (mode == 1) ? true : false;
		const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
		uint32_t bit_offset = 0;
		const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

		if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

		const uint32_t part = read_bits32(pBuf, bit_offset, 6);

		color_rgba endpoints[ENDPOINTS];
		for (uint32_t c = 0; c < COMPS; c++)
			for (uint32_t e = 0; e < ENDPOINTS; e++)
				endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);
		
		uint32_t pbits[4];
		for (uint32_t p = 0; p < PBITS; p++)
			pbits[p] = read_bits32(pBuf, bit_offset, 1);
						
		uint32_t weights[16];
		for (uint32_t i = 0; i < 16; i++)
			weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == basist::g_bc7_table_anchor_index_second_subset[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);
		
		assert(bit_offset == 128);

		for (uint32_t e = 0; e < ENDPOINTS; e++)
			for (uint32_t c = 0; c < 4; c++)
				endpoints[e][c] = (uint8_t)((c == ((mode == 7U) ? 4U : 3U)) ? 255 : bc7_dequant(endpoints[e][c], pbits[SHARED_PBITS ? (e >> 1) : e], ENDPOINT_BITS));
		
		color_rgba block_colors[2][8];
		for (uint32_t s = 0; s < 2; s++)
			for (uint32_t i = 0; i < WEIGHT_VALS; i++)
			{
				for (uint32_t c = 0; c < COMPS; c++)
					block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
				block_colors[s][i][3] = (COMPS == 3) ? 255 : block_colors[s][i][3];
			}

		for (uint32_t i = 0; i < 16; i++)
			pPixels[i] = block_colors[basist::g_bc7_partition2[part * 16 + i]][weights[i]];

		return true;
	}